

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

void __thiscall xray_re::xr_memory_writer::~xr_memory_writer(xr_memory_writer *this)

{
  (this->super_xr_writer)._vptr_xr_writer = (_func_int **)&PTR__xr_memory_writer_0023a448;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  xr_writer::~xr_writer(&this->super_xr_writer);
  return;
}

Assistant:

xr_memory_writer::~xr_memory_writer() {}